

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_getopt_long.c
# Opt level: O1

int parse_long_options(char **nargv,char *options,option *long_options,int *idx,int short_too,
                      int flags)

{
  byte bVar1;
  int iVar2;
  char *__s;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  size_t __n;
  char *pcVar9;
  option *poVar10;
  uint uVar11;
  bool bVar12;
  uint local_7c;
  char *local_68;
  
  __s = place;
  iVar2 = optind;
  if ((ulong)(uint)dash_prefix < 3) {
    pcVar6 = &DAT_0010e05c + *(int *)(&DAT_0010e05c + (ulong)(uint)dash_prefix * 4);
  }
  else {
    pcVar6 = "";
  }
  optind = optind + 1;
  local_68 = strchr(place,0x3d);
  if (local_68 == (char *)0x0) {
    __n = strlen(__s);
    local_68 = (char *)0x0;
  }
  else {
    __n = (long)local_68 - (long)__s;
    local_68 = local_68 + 1;
  }
  pcVar9 = long_options->name;
  uVar11 = 0;
  bVar12 = pcVar9 == (char *)0x0;
  if (bVar12) {
    local_7c = 0xffffffff;
  }
  else {
    poVar10 = long_options + 1;
    local_7c = 0xffffffff;
    bVar1 = 0;
    do {
      iVar5 = strncmp(__s,pcVar9,__n);
      uVar3 = local_7c;
      if (iVar5 == 0) {
        sVar7 = strlen(pcVar9);
        uVar4 = uVar11;
        if (sVar7 == __n) break;
        if (((__n != 1 || short_too == 0) && (uVar3 = uVar11, local_7c != 0xffffffff)) &&
           (((flags & 4U) != 0 ||
            (((lVar8 = (long)(int)local_7c, poVar10[-1].has_arg != long_options[lVar8].has_arg ||
              (poVar10[-1].flag != long_options[lVar8].flag)) ||
             (uVar3 = local_7c, poVar10[-1].val != long_options[lVar8].val)))))) {
          bVar1 = 1;
          uVar3 = local_7c;
        }
      }
      local_7c = uVar3;
      pcVar9 = poVar10->name;
      uVar11 = uVar11 + 1;
      poVar10 = poVar10 + 1;
      bVar12 = pcVar9 == (char *)0x0;
      uVar4 = local_7c;
    } while (!bVar12);
    local_7c = uVar4;
    uVar11 = (uint)(bVar1 & bVar12);
  }
  if ((char)uVar11 == '\0') {
    if (local_7c != 0xffffffff) {
      iVar5 = long_options[(int)local_7c].has_arg;
      if (local_68 != (char *)0x0 && iVar5 == 0) {
        if ((opterr != 0) && (*options != ':')) {
          warnx("option `%s%.*s\' doesn\'t allow an argument",pcVar6,__n & 0xffffffff,__s);
        }
        if (long_options[(int)local_7c].flag != (int *)0x0) {
          optopt = 0;
          return 0x3f;
        }
        optopt = long_options[(int)local_7c].val;
        return 0x3f;
      }
      pcVar9 = optarg;
      if (((iVar5 - 1U < 2) && (pcVar9 = local_68, local_68 == (char *)0x0)) &&
         (pcVar9 = optarg, iVar5 == 1)) {
        optind = iVar2 + 2;
        pcVar9 = nargv[(long)iVar2 + 1];
      }
      optarg = pcVar9;
      if ((long_options[(int)local_7c].has_arg == 1) && (optarg == (char *)0x0)) {
        if ((opterr != 0) && (*options != ':')) {
          warnx("option `%s%s\' requires an argument",pcVar6,__s);
        }
        optopt = 0;
        if (long_options[(int)local_7c].flag == (int *)0x0) {
          optopt = long_options[(int)local_7c].val;
        }
        optind = optind + -1;
        return (uint)(*options != ':') * 5 + 0x3a;
      }
      if (idx != (int *)0x0) {
        *idx = local_7c;
      }
      if (long_options[(int)local_7c].flag != (int *)0x0) {
        *long_options[(int)local_7c].flag = long_options[(int)local_7c].val;
        return 0;
      }
      return long_options[(int)local_7c].val;
    }
    if (short_too != 0) {
      optind = iVar2;
      return -1;
    }
    if ((opterr != 0) && (*options != ':')) {
      warnx("unrecognized option `%s%s\'",pcVar6,__s);
    }
  }
  else if ((opterr != 0) && (*options != ':')) {
    warnx("option `%s%.*s\' is ambiguous",pcVar6,__n & 0xffffffff,__s);
  }
  optopt = 0;
  return 0x3f;
}

Assistant:

static int
parse_long_options(char * const *nargv, const char *options,
	const struct option *long_options, int *idx, int short_too, int flags)
{
	char *current_argv, *has_equal;
#ifdef GNU_COMPATIBLE
	char *current_dash;
#endif
	size_t current_argv_len;
	int i, match, exact_match, second_partial_match;

	current_argv = place;
#ifdef GNU_COMPATIBLE
	switch (dash_prefix) {
		case D_PREFIX:
			current_dash = "-";
			break;
		case DD_PREFIX:
			current_dash = "--";
			break;
		case W_PREFIX:
			current_dash = "-W ";
			break;
		default:
			current_dash = "";
			break;
	}
#endif
	match = -1;
	exact_match = 0;
	second_partial_match = 0;

	optind++;

	if ((has_equal = strchr(current_argv, '=')) != NULL) {
		/* argument found (--option=arg) */
		current_argv_len = (size_t)(has_equal - current_argv);
		has_equal++;
	} else
		current_argv_len = strlen(current_argv);

	for (i = 0; long_options[i].name; i++) {
		/* find matching long option */
		if (strncmp(current_argv, long_options[i].name,
		    current_argv_len))
			continue;

		if (strlen(long_options[i].name) == current_argv_len) {
			/* exact match */
			match = i;
			exact_match = 1;
			break;
		}
		/*
		 * If this is a known short option, don't allow
		 * a partial match of a single character.
		 */
		if (short_too && current_argv_len == 1)
			continue;

		if (match == -1)	/* first partial match */
			match = i;
		else if ((flags & FLAG_LONGONLY) ||
			 long_options[i].has_arg !=
			     long_options[match].has_arg ||
			 long_options[i].flag != long_options[match].flag ||
			 long_options[i].val != long_options[match].val)
			second_partial_match = 1;
	}
	if (!exact_match && second_partial_match) {
		/* ambiguous abbreviation */
		if (PRINT_ERROR)
			warnx(ambig,
#ifdef GNU_COMPATIBLE
			     current_dash,
#endif
			     (int)current_argv_len,
			     current_argv);
		optopt = 0;
		return (BADCH);
	}
	if (match != -1) {		/* option found */
		if (long_options[match].has_arg == no_argument
		    && has_equal) {
			if (PRINT_ERROR)
				warnx(noarg,
#ifdef GNU_COMPATIBLE
				     current_dash,
#endif
				     (int)current_argv_len,
				     current_argv);
			/*
			 * XXX: GNU sets optopt to val regardless of flag
			 */
			if (long_options[match].flag == NULL)
				optopt = long_options[match].val;
			else
				optopt = 0;
#ifdef GNU_COMPATIBLE
			return (BADCH);
#else
			return (BADARG);
#endif
		}
		if (long_options[match].has_arg == required_argument ||
		    long_options[match].has_arg == optional_argument) {
			if (has_equal)
				optarg = has_equal;
			else if (long_options[match].has_arg ==
			    required_argument) {
				/*
				 * optional argument doesn't use next nargv
				 */
				optarg = nargv[optind++];
			}
		}
		if ((long_options[match].has_arg == required_argument)
		    && (optarg == NULL)) {
			/*
			 * Missing argument; leading ':' indicates no error
			 * should be generated.
			 */
			if (PRINT_ERROR)
				warnx(recargstring,
#ifdef GNU_COMPATIBLE
				    current_dash,
#endif
				    current_argv);
			/*
			 * XXX: GNU sets optopt to val regardless of flag
			 */
			if (long_options[match].flag == NULL)
				optopt = long_options[match].val;
			else
				optopt = 0;
			--optind;
			return (BADARG);
		}
	} else {			/* unknown option */
		if (short_too) {
			--optind;
			return (-1);
		}
		if (PRINT_ERROR)
			warnx(illoptstring,
#ifdef GNU_COMPATIBLE
			      current_dash,
#endif
			      current_argv);
		optopt = 0;
		return (BADCH);
	}
	if (idx)
		*idx = match;
	if (long_options[match].flag) {
		*long_options[match].flag = long_options[match].val;
		return (0);
	} else
		return (long_options[match].val);
}